

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolarDecomposition.cpp
# Opt level: O1

uint __thiscall
btPolarDecomposition::decompose
          (btPolarDecomposition *this,btMatrix3x3 *a,btMatrix3x3 *u,btMatrix3x3 *h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  uint unaff_EBP;
  uint uVar5;
  bool bVar6;
  float fVar7;
  btScalar bVar8;
  btScalar bVar9;
  btScalar bVar10;
  btScalar bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  
  uVar1 = *(undefined8 *)(a->m_el[0].m_floats + 2);
  *(undefined8 *)u->m_el[0].m_floats = *(undefined8 *)a->m_el[0].m_floats;
  *(undefined8 *)(u->m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)(a->m_el[1].m_floats + 2);
  *(undefined8 *)u->m_el[1].m_floats = *(undefined8 *)a->m_el[1].m_floats;
  *(undefined8 *)(u->m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)(a->m_el[2].m_floats + 2);
  *(undefined8 *)u->m_el[2].m_floats = *(undefined8 *)a->m_el[2].m_floats;
  *(undefined8 *)(u->m_el[2].m_floats + 2) = uVar1;
  fVar21 = a->m_el[1].m_floats[1];
  fVar25 = a->m_el[1].m_floats[2];
  fVar12 = a->m_el[0].m_floats[0];
  fVar22 = a->m_el[0].m_floats[1];
  fVar27 = a->m_el[0].m_floats[2];
  uVar1 = *(undefined8 *)(a->m_el[2].m_floats + 1);
  fVar15 = (float)uVar1;
  fVar16 = (float)((ulong)uVar1 >> 0x20);
  fVar24 = a->m_el[2].m_floats[0];
  fVar14 = a->m_el[1].m_floats[0];
  fVar7 = fVar21 * fVar16 - fVar25 * fVar15;
  uVar1 = *(undefined8 *)a->m_el[2].m_floats;
  uVar5 = 0;
  h->m_el[0].m_floats[3] = 0.0;
  fVar23 = fVar24 * fVar25 - fVar16 * fVar14;
  h->m_el[1].m_floats[3] = 0.0;
  fVar30 = fVar15 * fVar14 - fVar21 * (float)uVar1;
  fVar13 = 1.0 / (fVar27 * fVar30 + fVar12 * fVar7 + fVar22 * fVar23);
  *(ulong *)h->m_el[0].m_floats =
       CONCAT44((fVar27 * fVar15 - fVar22 * fVar16) * fVar13,fVar7 * fVar13);
  h->m_el[0].m_floats[2] = (fVar22 * fVar25 + -fVar27 * fVar21) * fVar13;
  *(ulong *)h->m_el[1].m_floats =
       CONCAT44((fVar16 * fVar12 - fVar24 * fVar27) * fVar13,fVar23 * fVar13);
  h->m_el[1].m_floats[2] = (fVar27 * fVar14 + -fVar12 * fVar25) * fVar13;
  *(ulong *)h->m_el[2].m_floats =
       CONCAT44(fVar13 * (fVar24 * fVar22 - fVar12 * (float)((ulong)uVar1 >> 0x20)),fVar13 * fVar30)
  ;
  h->m_el[2].m_floats[2] = fVar13 * (fVar12 * fVar21 + -fVar22 * fVar14);
  h->m_el[2].m_floats[3] = 0.0;
  if (this->m_maxIterations == 0) {
    bVar6 = true;
  }
  else {
    do {
      bVar8 = anon_unknown.dwarf_6e0f9::p1_norm(h);
      bVar9 = anon_unknown.dwarf_6e0f9::pinf_norm(h);
      bVar10 = anon_unknown.dwarf_6e0f9::p1_norm(u);
      bVar11 = anon_unknown.dwarf_6e0f9::pinf_norm(u);
      bVar6 = false;
      iVar4 = 2;
      if ((1.1920929e-07 <= ABS(bVar9 * bVar8)) && (1.1920929e-07 <= ABS(bVar11 * bVar10))) {
        fVar7 = powf((bVar9 * bVar8) / (bVar11 * bVar10),0.25);
        fVar20 = 1.0 / fVar7;
        fVar7 = fVar7 + -2.0;
        fVar21 = u->m_el[1].m_floats[2];
        fVar24 = h->m_el[0].m_floats[1];
        fVar14 = h->m_el[0].m_floats[2];
        fVar23 = (h->m_el[2].m_floats[1] * fVar20 + fVar7 * fVar21) * 0.5;
        fVar21 = fVar21 + fVar23;
        uVar1 = *(undefined8 *)u->m_el[0].m_floats;
        fVar31 = (float)uVar1;
        fVar32 = (float)((ulong)uVar1 >> 0x20);
        fVar18 = (h->m_el[0].m_floats[0] * fVar20 + fVar31 * fVar7) * 0.5;
        fVar19 = (h->m_el[1].m_floats[0] * fVar20 + fVar32 * fVar7) * 0.5;
        fVar31 = fVar31 + fVar18;
        fVar32 = fVar32 + fVar19;
        fVar25 = h->m_el[1].m_floats[1];
        fVar12 = h->m_el[1].m_floats[2];
        fVar22 = h->m_el[2].m_floats[2];
        fVar27 = h->m_el[2].m_floats[0];
        *(ulong *)u->m_el[0].m_floats = CONCAT44(fVar32,fVar31);
        iVar4 = 0;
        u->m_el[0].m_floats[3] = 0.0;
        uVar1 = *(undefined8 *)u->m_el[1].m_floats;
        fVar28 = (float)uVar1;
        fVar29 = (float)((ulong)uVar1 >> 0x20);
        fVar30 = (fVar24 * fVar20 + fVar7 * fVar28) * 0.5;
        fVar17 = (fVar25 * fVar20 + fVar7 * fVar29) * 0.5;
        fVar28 = fVar28 + fVar30;
        fVar29 = fVar29 + fVar17;
        *(ulong *)u->m_el[1].m_floats = CONCAT44(fVar29,fVar28);
        u->m_el[1].m_floats[2] = fVar21;
        u->m_el[1].m_floats[3] = 0.0;
        fVar25 = u->m_el[0].m_floats[2];
        fVar24 = u->m_el[2].m_floats[2];
        uVar1 = *(undefined8 *)u->m_el[2].m_floats;
        fVar15 = (float)uVar1;
        fVar16 = (float)((ulong)uVar1 >> 0x20);
        fVar14 = (fVar14 * fVar20 + fVar7 * fVar15) * 0.5;
        fVar13 = (fVar12 * fVar20 + fVar7 * fVar16) * 0.5;
        fVar15 = fVar15 + fVar14;
        fVar16 = fVar16 + fVar13;
        fVar26 = (fVar22 * fVar20 + fVar7 * fVar24) * 0.5;
        fVar27 = (fVar27 * fVar20 + fVar7 * fVar25) * 0.5;
        fVar24 = fVar24 + fVar26;
        fVar25 = fVar25 + fVar27;
        fVar22 = fVar21 * fVar15 - fVar24 * fVar28;
        *(ulong *)u->m_el[2].m_floats = CONCAT44(fVar16,fVar15);
        fVar20 = fVar29 * fVar24 - fVar16 * fVar21;
        u->m_el[2].m_floats[3] = 0.0;
        u->m_el[0].m_floats[2] = fVar25;
        u->m_el[2].m_floats[2] = fVar24;
        fVar7 = fVar28 * fVar16 + -fVar29 * fVar15;
        h->m_el[0].m_floats[3] = 0.0;
        h->m_el[1].m_floats[3] = 0.0;
        fVar12 = 1.0 / (fVar25 * fVar7 + fVar31 * fVar20 + fVar32 * fVar22);
        *(ulong *)h->m_el[0].m_floats =
             CONCAT44((fVar16 * fVar25 - fVar24 * fVar32) * fVar12,fVar20 * fVar12);
        h->m_el[1].m_floats[0] = fVar22 * fVar12;
        h->m_el[0].m_floats[2] = fVar12 * (fVar32 * fVar21 + fVar29 * -fVar25);
        *(ulong *)(h->m_el[1].m_floats + 1) =
             CONCAT44((fVar28 * fVar25 - fVar21 * fVar31) * fVar12,
                      (fVar31 * fVar24 - fVar15 * fVar25) * fVar12);
        *(ulong *)h->m_el[2].m_floats =
             CONCAT44(fVar12 * (fVar32 * fVar15 + -fVar31 * fVar16),fVar12 * fVar7);
        h->m_el[2].m_floats[2] = (fVar31 * fVar29 + -fVar32 * fVar28) * fVar12;
        fVar21 = ABS(fVar14) + ABS(fVar30) + ABS(fVar18);
        fVar25 = ABS(fVar13) + ABS(fVar17) + ABS(fVar19);
        fVar12 = ABS(fVar26) + ABS(fVar23) + ABS(fVar27);
        if (fVar21 <= fVar25) {
          fVar21 = fVar25;
        }
        h->m_el[2].m_floats[3] = 0.0;
        if (fVar21 <= fVar12) {
          fVar21 = fVar12;
        }
        bVar6 = true;
        if (fVar21 <= bVar10 * this->m_tolerance) {
          fVar21 = u->m_el[0].m_floats[2];
          fVar25 = u->m_el[1].m_floats[2];
          fVar12 = u->m_el[2].m_floats[2];
          fVar22 = a->m_el[0].m_floats[0];
          fVar27 = a->m_el[1].m_floats[0];
          fVar24 = a->m_el[2].m_floats[0];
          uVar1 = *(undefined8 *)u->m_el[0].m_floats;
          uVar2 = *(undefined8 *)u->m_el[1].m_floats;
          uVar3 = *(undefined8 *)u->m_el[2].m_floats;
          fVar14 = (float)uVar3;
          fVar13 = (float)((ulong)uVar3 >> 0x20);
          fVar19 = (float)uVar2;
          fVar20 = (float)((ulong)uVar2 >> 0x20);
          fVar16 = (float)uVar1;
          fVar17 = (float)((ulong)uVar1 >> 0x20);
          fVar15 = fVar24 * fVar14 + fVar22 * fVar16 + fVar27 * fVar19;
          uVar1 = *(undefined8 *)(a->m_el[0].m_floats + 1);
          uVar2 = *(undefined8 *)(a->m_el[1].m_floats + 1);
          uVar3 = *(undefined8 *)(a->m_el[2].m_floats + 1);
          fVar29 = (float)uVar2;
          fVar31 = (float)((ulong)uVar2 >> 0x20);
          fVar26 = (float)uVar1;
          fVar28 = (float)((ulong)uVar1 >> 0x20);
          fVar23 = (float)uVar3;
          fVar18 = (float)((ulong)uVar3 >> 0x20);
          fVar30 = fVar13 * fVar23 + fVar17 * fVar26 + fVar20 * fVar29;
          h->m_el[0].m_floats[0] = fVar15;
          fVar7 = fVar14 * fVar23 + fVar16 * fVar26 + fVar19 * fVar29;
          fVar14 = fVar14 * fVar18 + fVar16 * fVar28 + fVar19 * fVar31;
          *(ulong *)(h->m_el[0].m_floats + 1) = CONCAT44(fVar14,fVar7);
          bVar6 = false;
          h->m_el[0].m_floats[3] = 0.0;
          h->m_el[1].m_floats[3] = 0.0;
          fVar16 = fVar12 * fVar23 + fVar21 * fVar26 + fVar25 * fVar29;
          fVar23 = fVar12 * fVar18 + fVar21 * fVar28 + fVar25 * fVar31;
          *(ulong *)(h->m_el[2].m_floats + 1) = CONCAT44(fVar23,fVar16);
          h->m_el[2].m_floats[3] = 0.0;
          fVar7 = (fVar7 + fVar24 * fVar13 + fVar22 * fVar17 + fVar27 * fVar20) * 0.5;
          fVar21 = (fVar14 + fVar24 * fVar12 + fVar22 * fVar21 + fVar25 * fVar27) * 0.5;
          *(ulong *)h->m_el[0].m_floats = CONCAT44(fVar7,(fVar15 + fVar15) * 0.5);
          h->m_el[0].m_floats[2] = fVar21;
          h->m_el[1].m_floats[0] = fVar7;
          fVar25 = (fVar16 + fVar13 * fVar18 + fVar17 * fVar28 + fVar20 * fVar31) * 0.5;
          *(ulong *)(h->m_el[1].m_floats + 1) = CONCAT44(fVar25,(fVar30 + fVar30) * 0.5);
          h->m_el[2].m_floats[0] = fVar21;
          h->m_el[2].m_floats[1] = fVar25;
          h->m_el[2].m_floats[2] = (fVar23 + fVar23) * 0.5;
          iVar4 = 1;
          unaff_EBP = uVar5;
        }
      }
      if (!bVar6) goto LAB_0012fce7;
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->m_maxIterations);
    iVar4 = 2;
LAB_0012fce7:
    bVar6 = iVar4 == 2;
  }
  if (bVar6) {
    fVar21 = u->m_el[0].m_floats[2];
    fVar25 = u->m_el[1].m_floats[2];
    fVar12 = u->m_el[2].m_floats[2];
    fVar22 = a->m_el[0].m_floats[0];
    fVar27 = a->m_el[1].m_floats[0];
    fVar24 = a->m_el[2].m_floats[0];
    fVar13 = fVar24 * fVar12 + fVar22 * fVar21 + fVar25 * fVar27;
    uVar1 = *(undefined8 *)u->m_el[0].m_floats;
    uVar2 = *(undefined8 *)u->m_el[1].m_floats;
    uVar3 = *(undefined8 *)u->m_el[2].m_floats;
    fVar14 = (float)uVar3;
    fVar7 = (float)((ulong)uVar3 >> 0x20);
    fVar29 = (float)uVar2;
    fVar31 = (float)((ulong)uVar2 >> 0x20);
    fVar26 = (float)uVar1;
    fVar28 = (float)((ulong)uVar1 >> 0x20);
    fVar15 = fVar24 * fVar14 + fVar22 * fVar26 + fVar27 * fVar29;
    fVar16 = fVar24 * fVar7 + fVar22 * fVar28 + fVar27 * fVar31;
    uVar1 = *(undefined8 *)(a->m_el[0].m_floats + 1);
    uVar2 = *(undefined8 *)(a->m_el[1].m_floats + 1);
    uVar3 = *(undefined8 *)(a->m_el[2].m_floats + 1);
    h->m_el[0].m_floats[0] = fVar15;
    fVar19 = (float)uVar2;
    fVar20 = (float)((ulong)uVar2 >> 0x20);
    fVar17 = (float)uVar1;
    fVar18 = (float)((ulong)uVar1 >> 0x20);
    fVar23 = (float)uVar3;
    fVar30 = (float)((ulong)uVar3 >> 0x20);
    fVar22 = fVar14 * fVar23 + fVar26 * fVar17 + fVar29 * fVar19;
    fVar27 = fVar14 * fVar30 + fVar26 * fVar18 + fVar29 * fVar20;
    fVar24 = fVar7 * fVar23 + fVar28 * fVar17 + fVar31 * fVar19;
    fVar14 = fVar7 * fVar30 + fVar28 * fVar18 + fVar31 * fVar20;
    *(ulong *)(h->m_el[0].m_floats + 1) = CONCAT44(fVar27,fVar22);
    h->m_el[0].m_floats[3] = 0.0;
    h->m_el[1].m_floats[0] = fVar16;
    *(ulong *)(h->m_el[1].m_floats + 1) = CONCAT44(fVar14,fVar24);
    h->m_el[1].m_floats[3] = 0.0;
    h->m_el[2].m_floats[0] = fVar13;
    *(ulong *)(h->m_el[2].m_floats + 1) =
         CONCAT44(fVar12 * fVar30 + fVar21 * fVar18 + fVar25 * fVar20,
                  fVar12 * fVar23 + fVar21 * fVar17 + fVar25 * fVar19);
    h->m_el[2].m_floats[3] = 0.0;
    fVar21 = h->m_el[2].m_floats[2];
    fVar12 = (fVar22 + fVar16) * 0.5;
    fVar25 = (fVar27 + fVar13) * 0.5;
    *(ulong *)h->m_el[0].m_floats = CONCAT44(fVar12,(fVar15 + fVar15) * 0.5);
    h->m_el[0].m_floats[2] = fVar25;
    h->m_el[1].m_floats[0] = fVar12;
    fVar12 = (h->m_el[2].m_floats[1] + fVar14) * 0.5;
    *(ulong *)(h->m_el[1].m_floats + 1) = CONCAT44(fVar12,(fVar24 + fVar24) * 0.5);
    h->m_el[2].m_floats[0] = fVar25;
    h->m_el[2].m_floats[1] = fVar12;
    h->m_el[2].m_floats[2] = (fVar21 + fVar21) * 0.5;
    unaff_EBP = this->m_maxIterations;
  }
  return unaff_EBP;
}

Assistant:

unsigned int btPolarDecomposition::decompose(const btMatrix3x3& a, btMatrix3x3& u, btMatrix3x3& h) const
{
  // Use the 'u' and 'h' matrices for intermediate calculations
  u = a;
  h = a.inverse();

  for (unsigned int i = 0; i < m_maxIterations; ++i)
  {
    const btScalar h_1 = p1_norm(h);
    const btScalar h_inf = pinf_norm(h);
    const btScalar u_1 = p1_norm(u);
    const btScalar u_inf = pinf_norm(u);

    const btScalar h_norm = h_1 * h_inf;
    const btScalar u_norm = u_1 * u_inf;

    // The matrix is effectively singular so we cannot invert it
    if (btFuzzyZero(h_norm) || btFuzzyZero(u_norm))
      break;

    const btScalar gamma = btPow(h_norm / u_norm, 0.25f);
    const btScalar inv_gamma = btScalar(1.0) / gamma;

    // Determine the delta to 'u'
    const btMatrix3x3 delta = (u * (gamma - btScalar(2.0)) + h.transpose() * inv_gamma) * btScalar(0.5);

    // Update the matrices
    u += delta;
    h = u.inverse();

    // Check for convergence
    if (p1_norm(delta) <= m_tolerance * u_1)
    {
      h = u.transpose() * a;
      h = (h + h.transpose()) * 0.5;
      return i;
    }
  }

  // The algorithm has failed to converge to the specified tolerance, but we
  // want to make sure that the matrices returned are in the right form.
  h = u.transpose() * a;
  h = (h + h.transpose()) * 0.5;

  return m_maxIterations;
}